

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

void cxxopts::values::parse_value<std::__cxx11::string>
               (string *text,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *value)

{
  istream *piVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v_1;
  string token;
  stringstream in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8;
  undefined7 uStack_1c7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  byte abStack_198 [96];
  ios_base local_138 [264];
  
  if (text->_M_string_length == 0) {
    local_1b8._M_string_length = 0;
    local_1b8.field_2._M_local_buf[0] = '\0';
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_assign((string *)&local_1b8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)value,&local_1b8
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,
                      CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                               local_1b8.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8,(string *)text,_S_out|_S_in)
    ;
    local_1d0 = 0;
    local_1c8 = 0;
    local_1d8 = &local_1c8;
    if ((abStack_198[*(long *)(local_1b8._M_dataplus._M_p + -0x18)] & 2) == 0) {
      do {
        piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&local_1b8,(string *)&local_1d8,',');
        if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
        local_1f8._M_string_length = 0;
        local_1f8.field_2._M_local_buf[0] = '\0';
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_assign((string *)&local_1f8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)value,
                   &local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,
                          CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                                   local_1f8.field_2._M_local_buf[0]) + 1);
        }
      } while ((abStack_198[*(long *)(local_1b8._M_dataplus._M_p + -0x18)] & 2) == 0);
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void
    parse_value(const std::string& text, std::vector<T>& value)
    {
      if (text.empty()) {
        T v;
        parse_value(text, v);
        value.emplace_back(std::move(v));
        return;
      }
      std::stringstream in(text);
      std::string token;
      while(!in.eof() && std::getline(in, token, CXXOPTS_VECTOR_DELIMITER)) {
        T v;
        parse_value(token, v);
        value.emplace_back(std::move(v));
      }
    }